

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int th;
  double local_40;
  double h;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  parse_arg(argc,argv,&h,&th);
  std::chrono::_V2::system_clock::now();
  *(undefined8 *)(strtol + *(long *)(std::cout + -0x18)) = 0xf;
  local_30[1] = (code *)0x0;
  local_30[0] = y;
  local_18 = std::_Function_handler<double_(double),_double_(*)(double)>::_M_invoke;
  local_20 = std::_Function_handler<double_(double),_double_(*)(double)>::_M_manager;
  local_40 = integrate((function<double_(double)> *)local_30,-2.99,0.0,h,th);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  poVar1 = std::ostream::_M_insert<double>(local_40);
  std::operator<<(poVar1,"(");
  poVar1 = std::ostream::_M_insert<double>(local_40 + -1.59530474926);
  std::operator<<(poVar1,")\n\t");
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::operator<<(poVar1," ms");
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
  double h;
  int th;
  try{
    parse_arg(argc, argv, h, th);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  auto t = std::chrono::high_resolution_clock::now();
  std::cout.precision(15);
  auto res = integrate(y, -2.99, 0, h, th);
  std::cout << res << "(" << (res - 1.59530474926)  <<")\n\t";
  std::cout << std::chrono::duration_cast<std::chrono::milliseconds>(std::chrono::high_resolution_clock::now() - t).count() <<" ms";
}